

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O1

void ggml_compute_forward_scale(ggml_compute_params *params,ggml_tensor *dst)

{
  int *piVar1;
  uint *puVar2;
  uint uVar3;
  undefined1 auVar4 [64];
  int iVar5;
  ggml_tensor *pgVar6;
  int64_t iVar7;
  size_t sVar8;
  size_t sVar9;
  void *pvVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  byte bVar24;
  byte bVar25;
  char cVar26;
  int iVar27;
  int iVar28;
  long lVar29;
  long lVar30;
  char *pcVar31;
  ulong uVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  undefined8 uVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  int np;
  uint uVar40;
  ushort uVar41;
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  uint local_e0;
  
  pgVar6 = dst->src[0];
  if (pgVar6->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0xf35,"fatal error");
  }
  cVar26 = ggml_is_contiguous();
  if (cVar26 == '\0') {
    pcVar31 = "ggml_is_contiguous(src0)";
    uVar36 = 0xf06;
  }
  else {
    cVar26 = ggml_is_contiguous(dst);
    if (cVar26 == '\0') {
      pcVar31 = "ggml_is_contiguous(dst)";
      uVar36 = 0xf07;
    }
    else {
      cVar26 = ggml_are_same_shape(pgVar6,dst);
      if (cVar26 != '\0') {
        uVar3 = dst->op_params[0];
        iVar5 = params->ith;
        iVar28 = params->nth;
        iVar7 = pgVar6->ne[0];
        iVar27 = ggml_nrows(pgVar6);
        iVar28 = (iVar28 + -1 + iVar27) / iVar28;
        lVar37 = (long)iVar5 * (long)iVar28;
        iVar28 = iVar28 + (int)lVar37;
        if (iVar27 <= iVar28) {
          iVar28 = iVar27;
        }
        if ((int)lVar37 < iVar28) {
          sVar8 = pgVar6->nb[1];
          sVar9 = dst->nb[1];
          local_e0 = (uint)iVar7;
          lVar38 = (long)(int)local_e0;
          uVar40 = local_e0 & 0xffffffc0;
          auVar42 = vbroadcastss_avx512f(ZEXT416(uVar3));
          lVar29 = (long)(int)uVar40;
          lVar39 = lVar38;
          if (lVar38 < lVar29 + 1) {
            lVar39 = lVar29 + 1;
          }
          auVar43 = vpbroadcastq_avx512f();
          lVar34 = sVar9 * lVar37;
          lVar33 = lVar34 + lVar29 * 4;
          auVar44 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
          auVar45 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          auVar4 = vmovdqu64_avx512f(auVar43);
          do {
            if (dst->data != pgVar6->data) {
              memcpy((void *)((long)dst->data + lVar37 * sVar9),
                     (void *)((long)pgVar6->data + lVar37 * sVar8),lVar38 * 4);
              auVar45 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
              auVar44 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
              auVar43 = vmovdqu64_avx512f(auVar4);
            }
            pvVar10 = dst->data;
            if (0 < (int)uVar40) {
              lVar30 = (long)pvVar10 + lVar34;
              uVar32 = 0;
              do {
                lVar35 = 0;
                do {
                  auVar46 = vmulps_avx512f(auVar42,*(undefined1 (*) [64])(lVar30 + lVar35));
                  *(undefined1 (*) [64])(lVar30 + lVar35) = auVar46;
                  lVar35 = lVar35 + 0x40;
                } while (lVar35 != 0x100);
                uVar32 = uVar32 + 0x40;
                lVar30 = lVar30 + 0x100;
              } while (uVar32 < uVar40);
            }
            if (uVar40 != local_e0) {
              uVar32 = 0;
              do {
                auVar46 = vpbroadcastq_avx512f();
                auVar47 = vporq_avx512f(auVar46,auVar44);
                auVar46 = vporq_avx512f(auVar46,auVar45);
                uVar36 = vpcmpuq_avx512f(auVar46,auVar43,2);
                bVar24 = (byte)uVar36;
                uVar36 = vpcmpuq_avx512f(auVar47,auVar43,2);
                bVar25 = (byte)uVar36;
                uVar41 = CONCAT11(bVar25,bVar24);
                piVar1 = (int *)((long)pvVar10 + uVar32 * 4 + lVar33);
                auVar46._4_4_ = (uint)((byte)(uVar41 >> 1) & 1) * piVar1[1];
                auVar46._0_4_ = (uint)(bVar24 & 1) * *piVar1;
                auVar46._8_4_ = (uint)((byte)(uVar41 >> 2) & 1) * piVar1[2];
                auVar46._12_4_ = (uint)((byte)(uVar41 >> 3) & 1) * piVar1[3];
                auVar46._16_4_ = (uint)((byte)(uVar41 >> 4) & 1) * piVar1[4];
                auVar46._20_4_ = (uint)((byte)(uVar41 >> 5) & 1) * piVar1[5];
                auVar46._24_4_ = (uint)((byte)(uVar41 >> 6) & 1) * piVar1[6];
                auVar46._28_4_ = (uint)((byte)(uVar41 >> 7) & 1) * piVar1[7];
                auVar46._32_4_ = (uint)(bVar25 & 1) * piVar1[8];
                auVar46._36_4_ = (uint)(bVar25 >> 1 & 1) * piVar1[9];
                auVar46._40_4_ = (uint)(bVar25 >> 2 & 1) * piVar1[10];
                auVar46._44_4_ = (uint)(bVar25 >> 3 & 1) * piVar1[0xb];
                auVar46._48_4_ = (uint)(bVar25 >> 4 & 1) * piVar1[0xc];
                auVar46._52_4_ = (uint)(bVar25 >> 5 & 1) * piVar1[0xd];
                auVar46._56_4_ = (uint)(bVar25 >> 6 & 1) * piVar1[0xe];
                auVar46._60_4_ = (uint)(bVar25 >> 7) * piVar1[0xf];
                auVar46 = vmulps_avx512f(auVar42,auVar46);
                puVar2 = (uint *)((long)pvVar10 + uVar32 * 4 + lVar33);
                bVar11 = (bool)((byte)(uVar41 >> 1) & 1);
                bVar12 = (bool)((byte)(uVar41 >> 2) & 1);
                bVar13 = (bool)((byte)(uVar41 >> 3) & 1);
                bVar14 = (bool)((byte)(uVar41 >> 4) & 1);
                bVar15 = (bool)((byte)(uVar41 >> 5) & 1);
                bVar16 = (bool)((byte)(uVar41 >> 6) & 1);
                bVar17 = (bool)((byte)(uVar41 >> 7) & 1);
                bVar18 = (bool)(bVar25 >> 1 & 1);
                bVar19 = (bool)(bVar25 >> 2 & 1);
                bVar20 = (bool)(bVar25 >> 3 & 1);
                bVar21 = (bool)(bVar25 >> 4 & 1);
                bVar22 = (bool)(bVar25 >> 5 & 1);
                bVar23 = (bool)(bVar25 >> 6 & 1);
                *puVar2 = (uint)(bVar24 & 1) * auVar46._0_4_ | (uint)!(bool)(bVar24 & 1) * *puVar2;
                puVar2[1] = (uint)bVar11 * auVar46._4_4_ | (uint)!bVar11 * puVar2[1];
                puVar2[2] = (uint)bVar12 * auVar46._8_4_ | (uint)!bVar12 * puVar2[2];
                puVar2[3] = (uint)bVar13 * auVar46._12_4_ | (uint)!bVar13 * puVar2[3];
                puVar2[4] = (uint)bVar14 * auVar46._16_4_ | (uint)!bVar14 * puVar2[4];
                puVar2[5] = (uint)bVar15 * auVar46._20_4_ | (uint)!bVar15 * puVar2[5];
                puVar2[6] = (uint)bVar16 * auVar46._24_4_ | (uint)!bVar16 * puVar2[6];
                puVar2[7] = (uint)bVar17 * auVar46._28_4_ | (uint)!bVar17 * puVar2[7];
                puVar2[8] = (uint)(bVar25 & 1) * auVar46._32_4_ |
                            (uint)!(bool)(bVar25 & 1) * puVar2[8];
                puVar2[9] = (uint)bVar18 * auVar46._36_4_ | (uint)!bVar18 * puVar2[9];
                puVar2[10] = (uint)bVar19 * auVar46._40_4_ | (uint)!bVar19 * puVar2[10];
                puVar2[0xb] = (uint)bVar20 * auVar46._44_4_ | (uint)!bVar20 * puVar2[0xb];
                puVar2[0xc] = (uint)bVar21 * auVar46._48_4_ | (uint)!bVar21 * puVar2[0xc];
                puVar2[0xd] = (uint)bVar22 * auVar46._52_4_ | (uint)!bVar22 * puVar2[0xd];
                puVar2[0xe] = (uint)bVar23 * auVar46._56_4_ | (uint)!bVar23 * puVar2[0xe];
                puVar2[0xf] = (uint)(bVar25 >> 7) * auVar46._60_4_ |
                              (uint)!(bool)(bVar25 >> 7) * puVar2[0xf];
                uVar32 = uVar32 + 0x10;
              } while (((lVar39 - lVar29) + 0xfU & 0xfffffffffffffff0) != uVar32);
            }
            lVar37 = lVar37 + 1;
            lVar34 = lVar34 + sVar9;
            lVar33 = lVar33 + sVar9;
          } while (lVar37 != iVar28);
        }
        return;
      }
      pcVar31 = "ggml_are_same_shape(src0, dst)";
      uVar36 = 0xf08;
    }
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,uVar36,"GGML_ASSERT(%s) failed",pcVar31);
}

Assistant:

void ggml_compute_forward_scale(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_scale_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}